

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_test.cc
# Opt level: O0

void __thiscall PageHeapTest_Stats_Test::TestBody(PageHeapTest_Stats_Test *this)

{
  PageHeap *this_00;
  pointer pPVar1;
  Span *span;
  SpinLock *l_00;
  SpinLockHolder local_40;
  SpinLockHolder l;
  Span *s2;
  Span *s1;
  unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_> local_18;
  unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_> ph;
  PageHeapTest_Stats_Test *this_local;
  
  ph._M_t.super___uniq_ptr_impl<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>._M_t.
  super__Tuple_impl<0UL,_tcmalloc::PageHeap_*,_std::default_delete<tcmalloc::PageHeap>_>.
  super__Head_base<0UL,_tcmalloc::PageHeap_*,_false>._M_head_impl =
       (__uniq_ptr_data<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>,_true,_true>)
       (__uniq_ptr_data<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>,_true,_true>)
       this;
  this_00 = (PageHeap *)operator_new(0x1830e0);
  tcmalloc::PageHeap::PageHeap(this_00);
  std::unique_ptr<tcmalloc::PageHeap,std::default_delete<tcmalloc::PageHeap>>::
  unique_ptr<std::default_delete<tcmalloc::PageHeap>,void>
            ((unique_ptr<tcmalloc::PageHeap,std::default_delete<tcmalloc::PageHeap>> *)&local_18,
             this_00);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::get
                     (&local_18);
  CheckStats(pPVar1,0,0,0);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::operator->
                     (&local_18);
  span = tcmalloc::PageHeap::New(pPVar1,0x100);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::get
                     (&local_18);
  CheckStats(pPVar1,0x100,0,0);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::operator->
                     (&local_18);
  l.lock_ = (SpinLock *)tcmalloc::PageHeap::SplitForTest(pPVar1,span,0x80);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::operator->
                     (&local_18);
  tcmalloc::PageHeap::Delete(pPVar1,(Span *)l.lock_);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::get
                     (&local_18);
  CheckStats(pPVar1,0x100,0x80,0);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::operator->
                     (&local_18);
  l_00 = tcmalloc::PageHeap::pageheap_lock(pPVar1);
  SpinLockHolder::SpinLockHolder(&local_40,l_00);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::operator->
                     (&local_18);
  tcmalloc::PageHeap::ReleaseAtLeastNPages(pPVar1,1);
  SpinLockHolder::~SpinLockHolder(&local_40);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::get
                     (&local_18);
  CheckStats(pPVar1,0x100,0,0x80);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::operator->
                     (&local_18);
  tcmalloc::PageHeap::Delete(pPVar1,span);
  pPVar1 = std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::get
                     (&local_18);
  CheckStats(pPVar1,0x100,0x80,0x80);
  std::unique_ptr<tcmalloc::PageHeap,_std::default_delete<tcmalloc::PageHeap>_>::~unique_ptr
            (&local_18);
  return;
}

Assistant:

TEST(PageHeapTest, Stats) {
  std::unique_ptr<tcmalloc::PageHeap> ph(new tcmalloc::PageHeap());

  // Empty page heap
  CheckStats(ph.get(), 0, 0, 0);

  // Allocate a span 's1'
  tcmalloc::Span* s1 = ph->New(256);
  CheckStats(ph.get(), 256, 0, 0);

  // Split span 's1' into 's1', 's2'.  Delete 's2'
  tcmalloc::Span* s2 = ph->SplitForTest(s1, 128);
  ph->Delete(s2);
  CheckStats(ph.get(), 256, 128, 0);

  // Unmap deleted span 's2'
  {
      SpinLockHolder l(ph->pageheap_lock());
      ph->ReleaseAtLeastNPages(1);
  }
  CheckStats(ph.get(), 256, 0, 128);

  // Delete span 's1'
  ph->Delete(s1);
  CheckStats(ph.get(), 256, 128, 128);
}